

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O3

void png_create_colormap_entry
               (png_image_read_control *display,png_uint_32 ip,png_uint_32 red,png_uint_32 green,
               png_uint_32 blue,png_uint_32 alpha,int encoding)

{
  uint uVar1;
  png_fixed_point gamma_val;
  png_imagep paVar2;
  png_voidp pvVar3;
  bool bVar4;
  bool bVar5;
  png_uint_16 pVar6;
  png_uint_16 pVar7;
  png_uint_16 pVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  png_uint_32 local_54;
  
  uVar13 = (ulong)blue;
  uVar19 = (ulong)green;
  uVar20 = (ulong)red;
  paVar2 = display->image;
  uVar1 = paVar2->format;
  bVar21 = (uVar1 & 2) != 0;
  bVar4 = green == blue;
  bVar5 = red == green;
  if (0xff < ip) {
    png_error(paVar2->opaque->png_ptr,"color-map index out of range");
  }
  if ((encoding == 3) && (encoding = display->file_encoding, encoding == 0)) {
    set_file_encoding(display);
    encoding = display->file_encoding;
  }
  local_54 = alpha;
  switch(encoding) {
  case 1:
    encoding = 1;
    if ((uVar1 & 4) == 0 && (bVar21 || bVar4 && bVar5)) goto switchD_002c2f28_default;
    uVar20 = (ulong)png_sRGB_table[uVar20];
    uVar19 = (ulong)png_sRGB_table[uVar19];
    uVar13 = (ulong)png_sRGB_table[uVar13];
    goto LAB_002c300e;
  case 2:
    break;
  case 3:
    gamma_val = display->gamma_to_linear;
    pVar6 = png_gamma_16bit_correct(red * 0x101,gamma_val);
    uVar20 = (ulong)pVar6;
    pVar7 = png_gamma_16bit_correct(green * 0x101,gamma_val);
    uVar19 = (ulong)pVar7;
    pVar8 = png_gamma_16bit_correct(blue * 0x101,gamma_val);
    uVar13 = (ulong)pVar8;
    if ((uVar1 & 4) == 0 && (bVar21 || bVar4 && bVar5)) {
      uVar18 = (uint)pVar6 * 0x100 - (uint)pVar6;
      uVar9 = uVar18 >> 0xf;
      uVar11 = (uint)pVar7 * 0x100 - (uint)pVar7;
      uVar14 = uVar11 >> 0xf;
      uVar15 = (uint)pVar8 * 0xff >> 0xf;
      uVar13 = (ulong)(((uint)png_sRGB_delta[uVar15] * ((uint)pVar8 * 0xff & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar15] >> 8 & 0xff);
      encoding = 1;
      uVar19 = (ulong)(((uint)png_sRGB_delta[uVar14] * (uVar11 & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar14] >> 8 & 0xff);
      uVar20 = (ulong)(((uint)png_sRGB_delta[uVar9] * (uVar18 & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar9] >> 8 & 0xff);
      goto switchD_002c2f28_default;
    }
    local_54 = alpha * 0x101;
    break;
  case 4:
    uVar20 = (ulong)(red * 0x101);
    uVar19 = (ulong)(green * 0x101);
    uVar13 = (ulong)(blue * 0x101);
LAB_002c300e:
    local_54 = alpha * 0x101;
    break;
  default:
    goto switchD_002c2f28_default;
  }
  if (bVar21 || bVar4 && bVar5) {
    encoding = 2;
    if ((uVar1 & 4) == 0) {
      uVar18 = (int)uVar20 * 0xff;
      uVar17 = uVar18 >> 0xf;
      uVar9 = (int)uVar19 * 0xff;
      uVar14 = uVar9 >> 0xf;
      uVar11 = (int)uVar13 * 0xff;
      uVar15 = uVar11 >> 0xf;
      uVar13 = (ulong)(((uint)png_sRGB_delta[uVar15] * (uVar11 & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar15] >> 8 & 0xff);
      local_54 = local_54 * 0xff + 0x807f >> 0x10;
      encoding = 1;
      uVar19 = (ulong)(((uint)png_sRGB_delta[uVar14] * (uVar9 & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar14] >> 8 & 0xff);
      uVar20 = (ulong)(((uint)png_sRGB_delta[uVar17] * (uVar18 & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar17] >> 8 & 0xff);
    }
  }
  else {
    iVar12 = (int)uVar13 * 0x93e + (int)uVar19 * 0x5b8a + (int)uVar20 * 0x1b38;
    if ((uVar1 & 4) == 0) {
      uVar18 = iVar12 + 0x80;
      uVar18 = ((uVar18 & 0xffffff00) - (uVar18 >> 8)) + 0x40;
      uVar9 = uVar18 >> 0x16;
      uVar13 = (ulong)(byte)(((uint)png_sRGB_delta[uVar9] * (uVar18 >> 7 & 0x7fff) >> 0xc) +
                             (uint)png_sRGB_base[uVar9] >> 8);
      local_54 = local_54 * 0xff + 0x807f >> 0x10;
      encoding = 1;
      uVar19 = uVar13;
      uVar20 = uVar13;
    }
    else {
      uVar13 = (ulong)(iVar12 + 0x4000U >> 0xf);
      encoding = 2;
      uVar19 = uVar13;
      uVar20 = uVar13;
    }
  }
switchD_002c2f28_default:
  if (encoding != ((uVar1 & 4) >> 2) + 1) {
    png_error(paVar2->opaque->png_ptr,"bad encoding (internal error)");
  }
  uVar18 = paVar2->format;
  uVar9 = uVar18 & 0x21;
  uVar10 = (ulong)(uVar9 == 0x21);
  uVar11 = uVar18 >> 3 & 2;
  uVar18 = uVar18 & 3;
  uVar16 = (ulong)((uVar18 + 1) * ip);
  pvVar3 = display->colormap;
  uVar14 = (uint)(uVar9 == 0x21);
  if ((uVar1 & 4) == 0) {
    switch(uVar18) {
    case 1:
      *(char *)((long)pvVar3 + (uVar10 ^ 1) + uVar16) = (char)local_54;
    case 0:
      *(char *)((long)pvVar3 + (uVar9 == 0x21) + uVar16) = (char)uVar19;
      break;
    case 3:
      *(char *)((long)pvVar3 + (ulong)(uVar9 != 0x21) * 3 + uVar16) = (char)local_54;
    case 2:
      uVar10 = uVar10 | uVar11;
      *(char *)((long)pvVar3 + (uVar10 ^ 2) + uVar16) = (char)uVar13;
      *(char *)((long)pvVar3 + (ulong)(uVar9 == 0x21) + 1 + uVar16) = (char)uVar19;
      *(char *)((long)pvVar3 + uVar10 + uVar16) = (char)uVar20;
    }
  }
  else {
    switch(uVar18) {
    case 1:
      *(short *)((long)pvVar3 + (ulong)(uVar14 ^ 1) * 2 + uVar16 * 2) = (short)local_54;
    case 0:
      if (local_54 < 0xffff) {
        if (local_54 == 0) {
          uVar19 = 0;
        }
        else {
          uVar19 = (ulong)(((int)uVar19 * local_54 + 0x7fff) / 0xffff);
        }
      }
      *(short *)((long)pvVar3 + (ulong)(uVar9 == 0x21) * 2 + uVar16 * 2) = (short)uVar19;
      break;
    case 3:
      *(short *)((long)pvVar3 + (ulong)((uint)(uVar9 != 0x21) * 6) + uVar16 * 2) = (short)local_54;
    case 2:
      if (local_54 < 0xffff) {
        if (local_54 == 0) {
          uVar13 = 0;
          uVar19 = 0;
          uVar20 = 0;
        }
        else {
          uVar13 = (ulong)((int)uVar13 * local_54 + 0x7fff) / 0xffff;
          uVar19 = (ulong)((int)uVar19 * local_54 + 0x7fff) / 0xffff;
          uVar20 = (ulong)((int)uVar20 * local_54 + 0x7fff) / 0xffff;
        }
      }
      uVar11 = uVar11 | uVar14;
      *(short *)((long)pvVar3 + (ulong)(uVar11 ^ 2) * 2 + uVar16 * 2) = (short)uVar13;
      *(short *)((long)pvVar3 + (ulong)(uVar9 == 0x21) * 2 + uVar16 * 2 + 2) = (short)uVar19;
      *(short *)((long)pvVar3 + (ulong)uVar11 * 2 + uVar16 * 2) = (short)uVar20;
    }
  }
  return;
}

Assistant:

static void
png_create_colormap_entry(png_image_read_control *display,
    png_uint_32 ip, png_uint_32 red, png_uint_32 green, png_uint_32 blue,
    png_uint_32 alpha, int encoding)
{
   png_imagep image = display->image;
   const int output_encoding = (image->format & PNG_FORMAT_FLAG_LINEAR) != 0 ?
       P_LINEAR : P_sRGB;
   const int convert_to_Y = (image->format & PNG_FORMAT_FLAG_COLOR) == 0 &&
       (red != green || green != blue);

   if (ip > 255)
      png_error(image->opaque->png_ptr, "color-map index out of range");

   /* Update the cache with whether the file gamma is significantly different
    * from sRGB.
    */
   if (encoding == P_FILE)
   {
      if (display->file_encoding == P_NOTSET)
         set_file_encoding(display);

      /* Note that the cached value may be P_FILE too, but if it is then the
       * gamma_to_linear member has been set.
       */
      encoding = display->file_encoding;
   }

   if (encoding == P_FILE)
   {
      png_fixed_point g = display->gamma_to_linear;

      red = png_gamma_16bit_correct(red*257, g);
      green = png_gamma_16bit_correct(green*257, g);
      blue = png_gamma_16bit_correct(blue*257, g);

      if (convert_to_Y != 0 || output_encoding == P_LINEAR)
      {
         alpha *= 257;
         encoding = P_LINEAR;
      }

      else
      {
         red = PNG_sRGB_FROM_LINEAR(red * 255);
         green = PNG_sRGB_FROM_LINEAR(green * 255);
         blue = PNG_sRGB_FROM_LINEAR(blue * 255);
         encoding = P_sRGB;
      }
   }

   else if (encoding == P_LINEAR8)
   {
      /* This encoding occurs quite frequently in test cases because PngSuite
       * includes a gAMA 1.0 chunk with most images.
       */
      red *= 257;
      green *= 257;
      blue *= 257;
      alpha *= 257;
      encoding = P_LINEAR;
   }

   else if (encoding == P_sRGB &&
       (convert_to_Y  != 0 || output_encoding == P_LINEAR))
   {
      /* The values are 8-bit sRGB values, but must be converted to 16-bit
       * linear.
       */
      red = png_sRGB_table[red];
      green = png_sRGB_table[green];
      blue = png_sRGB_table[blue];
      alpha *= 257;
      encoding = P_LINEAR;
   }

   /* This is set if the color isn't gray but the output is. */
   if (encoding == P_LINEAR)
   {
      if (convert_to_Y != 0)
      {
         /* NOTE: these values are copied from png_do_rgb_to_gray */
         png_uint_32 y = (png_uint_32)6968 * red  + (png_uint_32)23434 * green +
            (png_uint_32)2366 * blue;

         if (output_encoding == P_LINEAR)
            y = (y + 16384) >> 15;

         else
         {
            /* y is scaled by 32768, we need it scaled by 255: */
            y = (y + 128) >> 8;
            y *= 255;
            y = PNG_sRGB_FROM_LINEAR((y + 64) >> 7);
            alpha = PNG_DIV257(alpha);
            encoding = P_sRGB;
         }

         blue = red = green = y;
      }

      else if (output_encoding == P_sRGB)
      {
         red = PNG_sRGB_FROM_LINEAR(red * 255);
         green = PNG_sRGB_FROM_LINEAR(green * 255);
         blue = PNG_sRGB_FROM_LINEAR(blue * 255);
         alpha = PNG_DIV257(alpha);
         encoding = P_sRGB;
      }
   }

   if (encoding != output_encoding)
      png_error(image->opaque->png_ptr, "bad encoding (internal error)");

   /* Store the value. */
   {
#     ifdef PNG_FORMAT_AFIRST_SUPPORTED
         const int afirst = (image->format & PNG_FORMAT_FLAG_AFIRST) != 0 &&
            (image->format & PNG_FORMAT_FLAG_ALPHA) != 0;
#     else
#        define afirst 0
#     endif
#     ifdef PNG_FORMAT_BGR_SUPPORTED
         const int bgr = (image->format & PNG_FORMAT_FLAG_BGR) != 0 ? 2 : 0;
#     else
#        define bgr 0
#     endif

      if (output_encoding == P_LINEAR)
      {
         png_uint_16p entry = png_voidcast(png_uint_16p, display->colormap);

         entry += ip * PNG_IMAGE_SAMPLE_CHANNELS(image->format);

         /* The linear 16-bit values must be pre-multiplied by the alpha channel
          * value, if less than 65535 (this is, effectively, composite on black
          * if the alpha channel is removed.)
          */
         switch (PNG_IMAGE_SAMPLE_CHANNELS(image->format))
         {
            case 4:
               entry[afirst ? 0 : 3] = (png_uint_16)alpha;
               /* FALLTHROUGH */

            case 3:
               if (alpha < 65535)
               {
                  if (alpha > 0)
                  {
                     blue = (blue * alpha + 32767U)/65535U;
                     green = (green * alpha + 32767U)/65535U;
                     red = (red * alpha + 32767U)/65535U;
                  }

                  else
                     red = green = blue = 0;
               }
               entry[afirst + (2 ^ bgr)] = (png_uint_16)blue;
               entry[afirst + 1] = (png_uint_16)green;
               entry[afirst + bgr] = (png_uint_16)red;
               break;

            case 2:
               entry[1 ^ afirst] = (png_uint_16)alpha;
               /* FALLTHROUGH */

            case 1:
               if (alpha < 65535)
               {
                  if (alpha > 0)
                     green = (green * alpha + 32767U)/65535U;

                  else
                     green = 0;
               }
               entry[afirst] = (png_uint_16)green;
               break;

            default:
               break;
         }
      }

      else /* output encoding is P_sRGB */
      {
         png_bytep entry = png_voidcast(png_bytep, display->colormap);

         entry += ip * PNG_IMAGE_SAMPLE_CHANNELS(image->format);

         switch (PNG_IMAGE_SAMPLE_CHANNELS(image->format))
         {
            case 4:
               entry[afirst ? 0 : 3] = (png_byte)alpha;
               /* FALLTHROUGH */
            case 3:
               entry[afirst + (2 ^ bgr)] = (png_byte)blue;
               entry[afirst + 1] = (png_byte)green;
               entry[afirst + bgr] = (png_byte)red;
               break;

            case 2:
               entry[1 ^ afirst] = (png_byte)alpha;
               /* FALLTHROUGH */
            case 1:
               entry[afirst] = (png_byte)green;
               break;

            default:
               break;
         }
      }

#     ifdef afirst
#        undef afirst
#     endif
#     ifdef bgr
#        undef bgr
#     endif
   }
}